

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbAddrModeIS(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  DecodeStatus In;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc8;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  fieldFromInstruction_4(in_ESI,0,3);
  uVar2 = fieldFromInstruction_4(in_ESI,3,5);
  In = DecodetGPRRegisterClass
                 (in_RCX,local_4,CONCAT44(uVar2,in_stack_ffffffffffffffc8),(void *)0x27fed2);
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,In);
  if (_Var1) {
    MCOperand_CreateImm0(in_RDI,(ulong)uVar2);
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeThumbAddrModeIS(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 0, 3);
	unsigned imm = fieldFromInstruction_4(Val, 3, 5);

	if (!Check(&S, DecodetGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}